

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OsCompat.cpp
# Opt level: O0

char * OsCompat::filename(char *str)

{
  char *pcVar1;
  char *in_RDI;
  char *fname;
  char *tmpStr;
  char *last;
  char *result;
  char *local_8;
  
  pcVar1 = strrchr(in_RDI,0x2e);
  local_8 = in_RDI;
  if ((pcVar1 != (char *)0x0) && ((*pcVar1 != '.' || (pcVar1 != in_RDI)))) {
    local_8 = (char *)malloc(0x100);
    pcVar1 = strtok(in_RDI,".");
    strncpy(local_8,pcVar1,0x100);
  }
  return local_8;
}

Assistant:

char * OsCompat::filename(const char *str) {
    char *result;
    char *last;
    char *tmpStr = const_cast<char *>(str);
    if ((last = strrchr(tmpStr, '.')) != nullptr ) {
        if ((*last == '.') && (last == tmpStr)) {
            return tmpStr;
        } else {
            result = (char*) malloc(_MAX_FNAME);
            char *fname = strtok(tmpStr,".");
            strncpy(result,fname,_MAX_FNAME);
            return result;
        }
    } else {
        return tmpStr;
    }
}